

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicode_compare.hpp
# Opt level: O3

size_t jessilib::starts_with_lengthi<char32_t,char>
                 (basic_string_view<char32_t,_std::char_traits<char32_t>_> in_string,
                 basic_string_view<char,_std::char_traits<char>_> in_prefix)

{
  wchar32 wVar1;
  char32_t cVar2;
  size_t sVar3;
  size_t sVar4;
  jessilib *pjVar5;
  size_t sVar6;
  jessilib *pjVar7;
  char *pcVar8;
  decode_result dVar9;
  basic_string_view<char,_std::char_traits<char>_> in_string_00;
  
  pcVar8 = in_prefix._M_str;
  pjVar5 = (jessilib *)in_prefix._M_len;
  pjVar7 = pjVar5;
  if (pjVar5 == (jessilib *)0x0 || in_string._M_len == 0) {
    sVar4 = 0;
  }
  else {
    sVar3 = 0;
    do {
      wVar1 = in_string._M_str[sVar3];
      in_string_00._M_str = (char *)pjVar5;
      in_string_00._M_len = (size_t)pcVar8;
      dVar9 = decode_codepoint_utf8<char>(pjVar7,in_string_00);
      sVar6 = dVar9.units;
      if (sVar6 == 0) {
        return 0;
      }
      if (wVar1 != dVar9.codepoint) {
        cVar2 = jessilib::fold(wVar1);
        dVar9 = (decode_result)jessilib::fold(dVar9.codepoint);
        if (cVar2 != dVar9.codepoint) {
          return 0;
        }
      }
      pjVar5 = (jessilib *)dVar9.units;
      pjVar7 = pjVar7 + -sVar6;
      sVar4 = sVar3 + 1;
    } while ((in_string._M_len - 1 != sVar3) &&
            (pcVar8 = pcVar8 + sVar6, sVar3 = sVar4, pjVar7 != (jessilib *)0x0));
  }
  sVar3 = 0;
  if (pjVar7 == (jessilib *)0x0) {
    sVar3 = sVar4;
  }
  return sVar3;
}

Assistant:

size_t starts_with_lengthi(std::basic_string_view<LhsCharT> in_string, std::basic_string_view<RhsCharT> in_prefix) {
	// If in_string and in_prefix are the same type, skip decoding each point
	if constexpr (std::is_same_v<LhsCharT, RhsCharT>) {
		if (in_string.size() < in_prefix.size()) {
			return 0;
		}
	}

	size_t codepoints_removed{};
	while (!in_string.empty() && !in_prefix.empty()) {
		decode_result string_front = decode_codepoint(in_string);
		decode_result prefix_front = decode_codepoint(in_prefix);

		if (string_front.units == 0
			|| prefix_front.units == 0) {
			// Failed to decode front codepoint; bad unicode sequence
			return 0;
		}

		if (!equalsi(string_front.codepoint, prefix_front.codepoint)) {
			// Codepoints don't fold to same value
			return 0;
		}

		// Codepoints are equal; trim off the fronts and continue
		in_string.remove_prefix(string_front.units);
		in_prefix.remove_prefix(prefix_front.units);
		codepoints_removed += string_front.units;
	}

	if (!in_prefix.empty()) {
		// We reached end of in_string before end of prefix
		return 0;
	}

	return codepoints_removed;
}